

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionTest.cpp
# Opt level: O0

string * __thiscall
AssertionTest::formatStreamedMessage(string *__return_storage_ptr__,AssertionTest *this,string *msg)

{
  bool bVar1;
  char *message;
  AssertHelper local_50 [3];
  Message local_38;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  string *msg_local;
  AssertionTest *this_local;
  
  gtest_ar.message_.ptr_ = msg;
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_30,"expectedStreamMessage_","msg",
             &this->expectedStreamMessage_,msg);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(&local_38);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              (local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/DariuszOstolski[P]cppassert/tests/AssertionTest.cpp"
               ,0xc,message);
    testing::internal::AssertHelper::operator=(local_50,&local_38);
    testing::internal::AssertHelper::~AssertHelper(local_50);
    testing::Message::~Message(&local_38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  std::operator+(__return_storage_ptr__,"\n",gtest_ar.message_.ptr_);
  return __return_storage_ptr__;
}

Assistant:

std::string formatStreamedMessage(const std::string &msg)
    {
        EXPECT_EQ(expectedStreamMessage_, msg);
        return "\n"+msg;
    }